

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5NextMethod(sqlite3_vtab_cursor *pCursor)

{
  long iFirst;
  char *pcVar1;
  sqlite3_vtab *psVar2;
  sqlite3_vtab *psVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  
  iVar4 = *(int *)&pCursor[4].pVtab;
  if (2 < iVar4) {
    if (iVar4 == 4) {
      iVar4 = fts5SorterNext((Fts5Cursor *)pCursor);
      return iVar4;
    }
    if (iVar4 == 3) {
      *(byte *)&pCursor[10].pVtab = *(byte *)&pCursor[10].pVtab | 1;
      return 0;
    }
    iVar4 = sqlite3_step((sqlite3_stmt *)pCursor[7].pVtab);
    if (iVar4 == 100) {
      return 0;
    }
    *(byte *)&pCursor[10].pVtab = *(byte *)&pCursor[10].pVtab | 1;
    iVar4 = sqlite3_reset((sqlite3_stmt *)pCursor[7].pVtab);
    return iVar4;
  }
  bVar6 = false;
  iVar4 = 0;
  if (((ulong)pCursor[10].pVtab & 0x20) != 0) {
    iFirst = ((Fts5Expr *)pCursor[8].pVtab)->pRoot->iRowid;
    iVar4 = sqlite3Fts5ExprFirst
                      ((Fts5Expr *)pCursor[8].pVtab,*(Fts5Index **)&pCursor->pVtab[1].nRef,iFirst,
                       *(int *)((long)&pCursor[4].pVtab + 4));
    bVar6 = false;
    pcVar1 = (pCursor[8].pVtab)->zErrMsg;
    if (iVar4 == 0) {
      bVar6 = iFirst != *(long *)(pcVar1 + 0x18);
    }
    uVar5 = *(uint *)&pCursor[10].pVtab & 0xffffff91;
    *(uint *)&pCursor[10].pVtab = uVar5 + 0x4e;
    if (*(int *)(pcVar1 + 4) != 0) {
      *(uint *)&pCursor[10].pVtab = uVar5 | 0x4f;
      return iVar4;
    }
  }
  if (bVar6 || iVar4 != 0) {
    return iVar4;
  }
  psVar2 = pCursor[6].pVtab;
  psVar3 = pCursor[8].pVtab;
  pcVar1 = psVar3->zErrMsg;
  do {
    iVar4 = (**(code **)(pcVar1 + 0x10))(psVar3,pcVar1,0,0);
  } while (*(int *)(pcVar1 + 8) != 0);
  if (*(int *)&psVar3[1].pModule == 0) {
    if (*(long *)(pcVar1 + 0x18) <= (long)psVar2) goto LAB_001b2027;
  }
  else if ((long)psVar2 <= *(long *)(pcVar1 + 0x18)) goto LAB_001b2027;
  pcVar1[4] = '\x01';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
LAB_001b2027:
  *(uint *)&pCursor[10].pVtab =
       *(uint *)((pCursor[8].pVtab)->zErrMsg + 4) | *(uint *)&pCursor[10].pVtab | 0x4e;
  return iVar4;
}

Assistant:

static int fts5NextMethod(sqlite3_vtab_cursor *pCursor){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCursor;
  int rc;

  assert( (pCsr->ePlan<3)==
          (pCsr->ePlan==FTS5_PLAN_MATCH || pCsr->ePlan==FTS5_PLAN_SOURCE) 
  );
  assert( !CsrFlagTest(pCsr, FTS5CSR_EOF) );

  if( pCsr->ePlan<3 ){
    int bSkip = 0;
    if( (rc = fts5CursorReseek(pCsr, &bSkip)) || bSkip ) return rc;
    rc = sqlite3Fts5ExprNext(pCsr->pExpr, pCsr->iLastRowid);
    CsrFlagSet(pCsr, sqlite3Fts5ExprEof(pCsr->pExpr));
    fts5CsrNewrow(pCsr);
  }else{
    switch( pCsr->ePlan ){
      case FTS5_PLAN_SPECIAL: {
        CsrFlagSet(pCsr, FTS5CSR_EOF);
        rc = SQLITE_OK;
        break;
      }
  
      case FTS5_PLAN_SORTED_MATCH: {
        rc = fts5SorterNext(pCsr);
        break;
      }
  
      default:
        rc = sqlite3_step(pCsr->pStmt);
        if( rc!=SQLITE_ROW ){
          CsrFlagSet(pCsr, FTS5CSR_EOF);
          rc = sqlite3_reset(pCsr->pStmt);
        }else{
          rc = SQLITE_OK;
        }
        break;
    }
  }
  
  return rc;
}